

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receiver_cluster.hpp
# Opt level: O1

vector<Sphere,_std::allocator<Sphere>_> *
treecut(vector<Sphere,_std::allocator<Sphere>_> *__return_storage_ptr__,SphereTree *hierarchy,
       vec3f cluster_center,float cluster_radius,float angle_limit)

{
  float fVar1;
  pointer pSVar2;
  undefined1 auVar3 [16];
  pointer pSVar4;
  float fVar5;
  float fVar6;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar7;
  float fVar8;
  vec3f cluster_center_00;
  initializer_list<Sphere> __l;
  vector<Sphere,_std::allocator<Sphere>_> cut;
  SphereTree c;
  vector<Sphere,_std::allocator<Sphere>_> local_80;
  undefined1 local_68 [16];
  SphereTree local_58;
  
  cluster_center_00.z = cluster_center.z;
  local_68._8_4_ = in_XMM0_Dc;
  local_68._0_8_ = cluster_center._0_8_;
  local_68._12_4_ = in_XMM0_Dd;
  if ((hierarchy->child).super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (hierarchy->child).super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    fVar1 = (hierarchy->bound).radius;
    fVar5 = sinf(angle_limit);
    fVar7 = (hierarchy->bound).center.x - (float)local_68._0_4_;
    fVar8 = (hierarchy->bound).center.y - (float)local_68._4_4_;
    fVar6 = (hierarchy->bound).center.z - cluster_center_00.z;
    fVar6 = fVar6 * fVar6 + fVar7 * fVar7 + fVar8 * fVar8;
    if (fVar6 < 0.0) {
      fVar6 = sqrtf(fVar6);
    }
    else {
      fVar6 = SQRT(fVar6);
    }
    if (fVar5 * (fVar6 - cluster_radius) <= fVar1) {
      (__return_storage_ptr__->super__Vector_base<Sphere,_std::allocator<Sphere>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<Sphere,_std::allocator<Sphere>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<Sphere,_std::allocator<Sphere>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pSVar4 = (hierarchy->child).super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pSVar2 = (hierarchy->child).super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (pSVar4 == pSVar2) {
        return __return_storage_ptr__;
      }
      do {
        local_58.bound.center.x = (pSVar4->bound).center.x;
        local_58.bound.center.y = (pSVar4->bound).center.y;
        local_58.bound._8_8_ = *(undefined8 *)&(pSVar4->bound).center.z;
        std::vector<SphereTree,_std::allocator<SphereTree>_>::vector(&local_58.child,&pSVar4->child)
        ;
        auVar3 = local_68;
        cluster_center_00.x = (data_t)local_68._0_4_;
        cluster_center_00.y = (data_t)local_68._4_4_;
        local_68 = auVar3;
        treecut(&local_80,&local_58,cluster_center_00,cluster_radius,angle_limit);
        std::vector<Sphere,std::allocator<Sphere>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<Sphere*,std::vector<Sphere,std::allocator<Sphere>>>>
                  ((vector<Sphere,std::allocator<Sphere>> *)__return_storage_ptr__,
                   (__return_storage_ptr__->super__Vector_base<Sphere,_std::allocator<Sphere>_>).
                   _M_impl.super__Vector_impl_data._M_finish,
                   local_80.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_80.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        if (local_80.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_80.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector(&local_58.child);
        pSVar4 = pSVar4 + 1;
      } while (pSVar4 != pSVar2);
      return __return_storage_ptr__;
    }
  }
  local_58.bound.center.x = (hierarchy->bound).center.x;
  local_58.bound.center.y = (hierarchy->bound).center.y;
  local_58.bound._8_8_ = *(undefined8 *)&(hierarchy->bound).center.z;
  __l._M_len = 1;
  __l._M_array = &local_58.bound;
  std::vector<Sphere,_std::allocator<Sphere>_>::vector
            (__return_storage_ptr__,__l,(allocator_type *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Sphere> treecut(const SphereTree& hierarchy, vec3f cluster_center, float cluster_radius, float angle_limit)
{
	// stop recursing if the blockersphere subtends an angle less than angle_limit
	if (hierarchy.child.empty() || hierarchy.bound.radius < sin(angle_limit) * (norm(hierarchy.bound.center - cluster_center) - cluster_radius))
		return {hierarchy.bound};
	std::vector<Sphere> res;
	for (auto c: hierarchy.child)
	{
		auto cut = treecut(c, cluster_center, cluster_radius, angle_limit);
		res.insert(res.end(), cut.begin(), cut.end());
	}
	return res;
}